

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_timer.c
# Opt level: O0

void test_close_while_armed(void)

{
  cio_error cVar1;
  undefined1 local_48 [4];
  cio_error err;
  cio_timer timer;
  
  timerfd_create_fake.return_val = 5;
  read_fake.custom_fake = read_blocks;
  cVar1 = cio_timer_init((cio_timer *)local_48,(cio_eventloop *)0x0,(cio_timer_close_hook_t)0x0);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x10f,UNITY_DISPLAY_STYLE_INT);
  cio_timer_expires_from_now((cio_timer *)local_48,2000,handle_timeout,(void *)0x0);
  cio_timer_close((cio_timer *)local_48);
  UnityAssertEqualNumber(1,(ulong)close_fake.call_count,(char *)0x0,0x114,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber(5,(long)close_fake.arg0_val,(char *)0x0,0x115,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)handle_timeout_fake.call_count,(char *)0x0,0x117,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (-0x7d,(long)handle_timeout_fake.arg2_val,(char *)0x0,0x118,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)local_48,(UNITY_INT)handle_timeout_fake.arg0_val,(char *)0x0,0x119,
             UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_close_while_armed(void)
{
	static const int timerfd = 5;
	timerfd_create_fake.return_val = timerfd;
	read_fake.custom_fake = read_blocks;

	struct cio_timer timer;
	enum cio_error err = cio_timer_init(&timer, NULL, NULL);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);

	cio_timer_expires_from_now(&timer, 2000, handle_timeout, NULL);

	cio_timer_close(&timer);
	TEST_ASSERT_EQUAL(1, close_fake.call_count);
	TEST_ASSERT_EQUAL(timerfd, close_fake.arg0_val);

	TEST_ASSERT_EQUAL(1, handle_timeout_fake.call_count);
	TEST_ASSERT_EQUAL(CIO_OPERATION_ABORTED, handle_timeout_fake.arg2_val);
	TEST_ASSERT_EQUAL(&timer, handle_timeout_fake.arg0_val);
}